

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_transaction_controller.cpp
# Opt level: O0

void __thiscall
TransactionController_CreateP2wpkhSignatureHash_Test_Test::TestBody
          (TransactionController_CreateP2wpkhSignatureHash_Test_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *rhs;
  Amount AVar3;
  AssertionResult gtest_ar;
  ByteData sighash;
  TransactionController txc;
  string expect_sighash;
  Amount amount;
  SigHashType sighash_type;
  Pubkey pubkey;
  uint32_t vout;
  Txid txid;
  string tx;
  ByteData *pBVar4;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  string *in_stack_fffffffffffffdb8;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  AssertHelper local_1f8;
  Message local_1f0;
  string local_1e8;
  AssertionResult local_1c8;
  AssertHelper local_1b8;
  Message local_1b0;
  SigHashType local_1a4 [3];
  SigHashType *in_stack_fffffffffffffe88;
  Pubkey *in_stack_fffffffffffffe90;
  uint32_t in_stack_fffffffffffffe9c;
  Txid *in_stack_fffffffffffffea0;
  TransactionController *in_stack_fffffffffffffea8;
  Amount *in_stack_fffffffffffffec0;
  WitnessVersion in_stack_fffffffffffffec8;
  allocator local_111;
  string local_110 [32];
  pointer local_f0;
  undefined1 local_e8;
  undefined1 local_e0 [31];
  allocator local_c1;
  string local_c0;
  Pubkey local_a0;
  undefined4 local_88;
  allocator local_81;
  string local_80;
  Txid local_60;
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_28,
             "0200000001efcdab89674523010000000000000000000000000000000000000000000000000000000000ffffffff01406f4001000000001976a9144b8fe2da0c979ec6027dc2287e65569f41d483ec88ac00000000"
             ,&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_80,"0000000000000000000000000000000000000000000000000123456789abcdef",
             &local_81);
  cfd::core::Txid::Txid(&local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  local_88 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c0,
             "023e5e7a4a435f526a8b34d54c7355c8e57392b591b5a189ec88731953c568f8da",&local_c1);
  cfd::core::Pubkey::Pubkey(&local_a0,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  cfd::core::SigHashType::SigHashType((SigHashType *)(local_e0 + 0x10),kSigHashAll,false,false);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(21000000);
  local_f0 = (pointer)AVar3.amount_;
  local_e8 = AVar3.ignore_check_;
  local_e0._0_8_ = local_f0;
  local_e0[8] = local_e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_110,"a3f0fa9b3e727bb746509b40a7cac316bf36685d55bebd6c7271d6e3a976f12d",&local_111
            );
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  cfd::TransactionController::TransactionController
            ((TransactionController *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
             in_stack_fffffffffffffdb8);
  cfd::core::ByteData::ByteData((ByteData *)&stack0xfffffffffffffe80);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::SigHashType::SigHashType(local_1a4,(SigHashType *)(local_e0 + 0x10));
      pBVar4 = (ByteData *)local_e0;
      in_stack_fffffffffffffdb0 = 0;
      cfd::TransactionController::CreateSignatureHash
                (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                 in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffec0,
                 in_stack_fffffffffffffec8);
      cfd::core::ByteData::operator=
                ((ByteData *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),pBVar4);
      cfd::core::ByteData::~ByteData((ByteData *)0x2384af);
    }
  }
  else {
    testing::Message::Message(&local_1b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_controller.cpp"
               ,0x46,
               "Expected: sighash = txc.CreateSignatureHash(txid, vout, pubkey, sighash_type, amount, WitnessVersion::kVersion0) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    testing::Message::~Message((Message *)0x23869b);
  }
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1e8,(ByteData *)&stack0xfffffffffffffe80);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_1c8,"sighash.GetHex().c_str()","expect_sighash.c_str()",pcVar2,rhs);
  std::__cxx11::string::~string((string *)&local_1e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_1f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x2387bc);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_controller.cpp"
               ,0x48,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    testing::Message::~Message((Message *)0x23880a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x238859);
  cfd::core::ByteData::~ByteData((ByteData *)0x238866);
  cfd::TransactionController::~TransactionController
            ((TransactionController *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0))
  ;
  std::__cxx11::string::~string(local_110);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x23888d);
  cfd::core::Txid::~Txid((Txid *)0x23889a);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

TEST(TransactionController, CreateP2wpkhSignatureHash_Test) {
  // input-only transaction
  std::string tx = "0200000001efcdab89674523010000000000000000000000000000000000000000000000000000000000ffffffff01406f4001000000001976a9144b8fe2da0c979ec6027dc2287e65569f41d483ec88ac00000000";
  Txid txid("0000000000000000000000000000000000000000000000000123456789abcdef");
  uint32_t vout = 0;
  Pubkey pubkey("023e5e7a4a435f526a8b34d54c7355c8e57392b591b5a189ec88731953c568f8da");
  SigHashType sighash_type(SigHashAlgorithm::kSigHashAll);
  Amount amount = Amount::CreateBySatoshiAmount(21000000);

  std::string expect_sighash = "a3f0fa9b3e727bb746509b40a7cac316bf36685d55bebd6c7271d6e3a976f12d";
  
  TransactionController txc(tx);
  ByteData sighash;
  EXPECT_NO_THROW(sighash = txc.CreateSignatureHash(txid, vout, pubkey, sighash_type, amount, WitnessVersion::kVersion0));
  
  EXPECT_STREQ(sighash.GetHex().c_str(), expect_sighash.c_str());
}